

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectDrawSurface.cpp
# Opt level: O1

void __thiscall
nv::DDSHeader::setPixelFormat
          (DDSHeader *this,uint bitcount,uint rmask,uint gmask,uint bmask,uint amask)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  if ((gmask & rmask) != 0) {
    iVar2 = nvAbort("(rmask & gmask) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/DirectDrawSurface.cpp"
                    ,0x292,"void nv::DDSHeader::setPixelFormat(uint, uint, uint, uint, uint)");
    if (iVar2 == 1) {
      raise(5);
    }
  }
  if ((bmask & rmask) != 0) {
    iVar2 = nvAbort("(rmask & bmask) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/DirectDrawSurface.cpp"
                    ,0x293,"void nv::DDSHeader::setPixelFormat(uint, uint, uint, uint, uint)");
    if (iVar2 == 1) {
      raise(5);
    }
  }
  if ((amask & rmask) != 0) {
    iVar2 = nvAbort("(rmask & amask) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/DirectDrawSurface.cpp"
                    ,0x294,"void nv::DDSHeader::setPixelFormat(uint, uint, uint, uint, uint)");
    if (iVar2 == 1) {
      raise(5);
    }
  }
  if ((bmask & gmask) != 0) {
    iVar2 = nvAbort("(gmask & bmask) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/DirectDrawSurface.cpp"
                    ,0x295,"void nv::DDSHeader::setPixelFormat(uint, uint, uint, uint, uint)");
    if (iVar2 == 1) {
      raise(5);
    }
  }
  if ((amask & gmask) != 0) {
    iVar2 = nvAbort("(gmask & amask) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/DirectDrawSurface.cpp"
                    ,0x296,"void nv::DDSHeader::setPixelFormat(uint, uint, uint, uint, uint)");
    if (iVar2 == 1) {
      raise(5);
    }
  }
  if ((amask & bmask) != 0) {
    iVar2 = nvAbort("(bmask & amask) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/DirectDrawSurface.cpp"
                    ,0x297,"void nv::DDSHeader::setPixelFormat(uint, uint, uint, uint, uint)");
    if (iVar2 == 1) {
      raise(5);
    }
  }
  (this->pf).flags = 0x41 - (amask == 0);
  if (bitcount == 0) {
    uVar3 = gmask | rmask | bmask | amask;
    if (uVar3 == 0) {
      bitcount = 0;
    }
    else {
      uVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      bitcount = (uVar1 ^ 0xffffffe0) + 0x21;
    }
  }
  if (0x1f < bitcount - 1) {
    iVar2 = nvAbort("bitcount > 0 && bitcount <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/DirectDrawSurface.cpp"
                    ,0x2a9,"void nv::DDSHeader::setPixelFormat(uint, uint, uint, uint, uint)");
    if (iVar2 == 1) {
      raise(5);
    }
  }
  uVar4 = 8;
  if ((8 < bitcount) && (uVar4 = 0x10, 0x10 < bitcount)) {
    uVar4 = (uint)(0x18 < bitcount) * 8 + 0x18;
  }
  (this->pf).fourcc = 0;
  (this->pf).bitcount = uVar4;
  (this->pf).rmask = rmask;
  (this->pf).gmask = gmask;
  (this->pf).bmask = bmask;
  (this->pf).amask = amask;
  return;
}

Assistant:

void DDSHeader::setPixelFormat(uint bitcount, uint rmask, uint gmask, uint bmask, uint amask)
{
	// Make sure the masks are correct.
	nvCheck((rmask & gmask) == 0);
	nvCheck((rmask & bmask) == 0);
	nvCheck((rmask & amask) == 0);
	nvCheck((gmask & bmask) == 0);
	nvCheck((gmask & amask) == 0);
	nvCheck((bmask & amask) == 0);

	this->pf.flags = DDPF_RGB;

	if (amask != 0) {
		this->pf.flags |= DDPF_ALPHAPIXELS;
	}

	if (bitcount == 0)
	{
		// Compute bit count from the masks.
		uint total = rmask | gmask | bmask | amask;
		while(total != 0) {
			bitcount++;
			total >>= 1;
		}
	}

	nvCheck(bitcount > 0 && bitcount <= 32);

	// Align to 8.
	if (bitcount <= 8) bitcount = 8;
	else if (bitcount <= 16) bitcount = 16;
	else if (bitcount <= 24) bitcount = 24;
	else bitcount = 32;

	this->pf.fourcc = 0; //findD3D9Format(bitcount, rmask, gmask, bmask, amask);
	this->pf.bitcount = bitcount;
	this->pf.rmask = rmask;
	this->pf.gmask = gmask;
	this->pf.bmask = bmask;
	this->pf.amask = amask;
}